

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_suite.cpp
# Opt level: O0

void buffer_suite::format_vector(void)

{
  undefined1 *this;
  reference pvVar1;
  undefined1 local_74 [2];
  undefined1 local_72 [2];
  undefined1 local_70 [2];
  undefined1 local_6e [2];
  undefined4 local_6c;
  size_type local_68 [3];
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> result;
  variable data;
  
  this = &result.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>
            ((basic_variable<std::allocator<char>_> *)this,true);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_50);
  trial::protocol::json::format<std::vector<char,std::allocator<char>>,std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)this,
             (vector<char,_std::allocator<char>_> *)local_50);
  local_68[0] = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)local_50);
  local_6c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("result.size()","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x2f,"void buffer_suite::format_vector()",local_68,&local_6c);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,0);
  local_6e[0] = 0x74;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[0]","\'t\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x30,"void buffer_suite::format_vector()",pvVar1,local_6e);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,1);
  local_70[0] = 0x72;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[1]","\'r\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x31,"void buffer_suite::format_vector()",pvVar1,local_70);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,2);
  local_72[0] = 0x75;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[2]","\'u\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x32,"void buffer_suite::format_vector()",pvVar1,local_72);
  pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_50,3);
  local_74[0] = 0x65;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,char,char>
            ("result[3]","\'e\'",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/format_suite.cpp"
             ,0x33,"void buffer_suite::format_vector()",pvVar1,local_74);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)
             &result.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return;
}

Assistant:

void format_vector()
{
    variable data(true);
    std::vector<char> result;
    json::format(data, result);
    TRIAL_PROTOCOL_TEST_EQUAL(result.size(), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result[0], 't');
    TRIAL_PROTOCOL_TEST_EQUAL(result[1], 'r');
    TRIAL_PROTOCOL_TEST_EQUAL(result[2], 'u');
    TRIAL_PROTOCOL_TEST_EQUAL(result[3], 'e');
}